

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O0

Status * __thiscall draco::PlyDecoder::DecodeVertexData(PlyDecoder *this,PlyElement *vertex_element)

{
  uchar uVar1;
  DataType DVar2;
  DataType DVar3;
  int32_t iVar4;
  PlyProperty *pPVar5;
  reference pvVar6;
  reference pvVar7;
  pointer __p;
  PlyElement *in_RDX;
  size_type __n;
  long in_RSI;
  Status *in_RDI;
  float fVar8;
  int j;
  array<unsigned_char,_4UL> val_1;
  ValueType i_1;
  int32_t att_id_2;
  GeometryAttribute va_2;
  PlyProperty *p;
  vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
  color_readers;
  PlyProperty *a_prop;
  PlyProperty *b_prop;
  PlyProperty *g_prop;
  PlyProperty *r_prop;
  int num_colors;
  array<float,_3UL> val;
  ValueType i;
  int att_id_1;
  GeometryAttribute va_1;
  PlyPropertyReader<float> z_reader;
  PlyPropertyReader<float> y_reader;
  PlyPropertyReader<float> x_reader;
  PlyProperty *n_z_prop;
  PlyProperty *n_y_prop;
  PlyProperty *n_x_prop;
  vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_> properties;
  int att_id;
  GeometryAttribute va;
  DataType dt;
  ValueType num_vertices;
  PlyProperty *z_prop;
  PlyProperty *y_prop;
  PlyProperty *x_prop;
  undefined8 in_stack_fffffffffffff8d8;
  Code CVar9;
  GeometryAttribute *in_stack_fffffffffffff8e0;
  PointCloud *pPVar10;
  value_type *in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8f0;
  int in_stack_fffffffffffff8f4;
  PlyElement *in_stack_fffffffffffff8f8;
  Type attribute_type;
  GeometryAttribute *in_stack_fffffffffffff900;
  GeometryAttribute *in_stack_fffffffffffff908;
  undefined4 in_stack_fffffffffffff910;
  AttributeValueIndex in_stack_fffffffffffff914;
  char *in_stack_fffffffffffff918;
  GeometryAttribute *in_stack_fffffffffffff920;
  PointCloud *in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff930;
  DataType in_stack_fffffffffffff934;
  undefined8 in_stack_fffffffffffff978;
  int num_vertices_00;
  PointAttribute *in_stack_fffffffffffff980;
  vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
  *in_stack_fffffffffffff988;
  PlyDecoder *in_stack_fffffffffffff990;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_514;
  int local_510;
  uint local_508;
  int local_504;
  undefined1 local_4c0 [15];
  allocator<char> local_4b1;
  string local_4b0 [32];
  char local_490 [15];
  allocator<char> local_481;
  string local_480 [47];
  allocator<char> local_451;
  string local_450 [40];
  int local_428;
  allocator<char> local_421;
  string local_420 [32];
  PlyProperty *local_400;
  vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
  local_3f8;
  allocator<char> local_3d9;
  string local_3d8 [32];
  PlyProperty *local_3b8;
  allocator<char> local_3a9;
  string local_3a8 [32];
  PlyProperty *local_388;
  allocator<char> local_379;
  string local_378 [32];
  PlyProperty *local_358;
  allocator<char> local_349;
  string local_348 [32];
  PlyProperty *local_328;
  int local_31c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_318 [4];
  uint local_308;
  int local_304;
  allocator<char> local_241;
  string local_240 [32];
  PlyProperty *local_220;
  allocator<char> local_211;
  string local_210 [32];
  PlyProperty *local_1f0;
  allocator<char> local_1e1;
  string local_1e0 [32];
  PlyProperty *local_1c0;
  int local_19c;
  allocator<char> local_151;
  string local_150 [32];
  DataType local_130;
  allocator<char> local_129;
  string local_128 [32];
  ValueType local_108;
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [32];
  PlyProperty *local_b8;
  allocator<char> local_a9;
  string local_a8 [32];
  PlyProperty *local_88;
  allocator<char> local_79;
  string local_78 [32];
  PlyProperty *local_58;
  allocator<char> local_39;
  string local_38 [32];
  PlyElement *local_18;
  
  num_vertices_00 = (int)((ulong)in_stack_fffffffffffff978 >> 0x20);
  CVar9 = (Code)((ulong)in_stack_fffffffffffff8d8 >> 0x20);
  if (in_RDX == (PlyElement *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff920,in_stack_fffffffffffff918,
               (allocator<char> *)
               CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910));
    Status::Status((Status *)in_stack_fffffffffffff8e0,CVar9,(string *)0x12a29e);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
    return in_RDI;
  }
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910)
            );
  pPVar5 = PlyElement::GetPropertyByName
                     (in_stack_fffffffffffff8f8,
                      (string *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  local_58 = pPVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910)
            );
  pPVar5 = PlyElement::GetPropertyByName
                     (in_stack_fffffffffffff8f8,
                      (string *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  local_88 = pPVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910)
            );
  pPVar5 = PlyElement::GetPropertyByName
                     (in_stack_fffffffffffff8f8,
                      (string *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  local_b8 = pPVar5;
  if (((local_58 == (PlyProperty *)0x0) || (local_88 == (PlyProperty *)0x0)) ||
     (pPVar5 == (PlyProperty *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff920,in_stack_fffffffffffff918,
               (allocator<char> *)
               CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910));
    Status::Status((Status *)in_stack_fffffffffffff8e0,CVar9,(string *)0x12a51e);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator(&local_101);
    return in_RDI;
  }
  local_108 = PlyElement::num_entries(local_18);
  PointCloud::set_num_points(*(PointCloud **)(in_RSI + 0x40),local_108);
  DVar2 = PlyProperty::data_type(local_58);
  DVar3 = PlyProperty::data_type(local_88);
  if (DVar2 != DVar3) {
LAB_0012a6f1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff920,in_stack_fffffffffffff918,
               (allocator<char> *)
               CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910));
    Status::Status((Status *)in_stack_fffffffffffff8e0,CVar9,(string *)0x12a73e);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator(&local_129);
    return in_RDI;
  }
  DVar2 = PlyProperty::data_type(local_88);
  DVar3 = PlyProperty::data_type(local_b8);
  if (DVar2 != DVar3) goto LAB_0012a6f1;
  local_130 = PlyProperty::data_type(local_58);
  if ((local_130 != DT_FLOAT32) && (local_130 != DT_INT32)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff920,in_stack_fffffffffffff918,
               (allocator<char> *)
               CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910));
    Status::Status((Status *)in_stack_fffffffffffff8e0,CVar9,(string *)0x12a825);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator(&local_151);
    return in_RDI;
  }
  GeometryAttribute::GeometryAttribute(in_stack_fffffffffffff8e0);
  iVar4 = DataTypeLength(local_130);
  __p = (pointer)(long)(iVar4 * 3);
  pPVar10 = (PointCloud *)0x0;
  GeometryAttribute::Init
            (in_stack_fffffffffffff900,(Type)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
             (DataBuffer *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
             (uint8_t)((ulong)in_stack_fffffffffffff8e8 >> 0x38),(DataType)in_stack_fffffffffffff8e8
             ,false,CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910),
             (int64_t)in_stack_fffffffffffff918);
  local_19c = PointCloud::AddAttribute
                        (in_stack_fffffffffffff928,in_stack_fffffffffffff920,
                         SUB81((ulong)in_stack_fffffffffffff918 >> 0x38,0),
                         (ValueType)in_stack_fffffffffffff918);
  std::vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>::vector
            ((vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_> *)
             0x12a933);
  std::vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>::push_back
            ((vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_> *)
             CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),in_stack_fffffffffffff8e8
            );
  std::vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>::push_back
            ((vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_> *)
             CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),in_stack_fffffffffffff8e8
            );
  std::vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>::push_back
            ((vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_> *)
             CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),in_stack_fffffffffffff8e8
            );
  iVar4 = (int32_t)((ulong)__p >> 0x20);
  if (local_130 == DT_FLOAT32) {
    PointCloud::attribute(pPVar10,iVar4);
    ReadPropertiesToAttribute<float>
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980,
               num_vertices_00);
  }
  else if (local_130 == DT_INT32) {
    PointCloud::attribute(pPVar10,iVar4);
    ReadPropertiesToAttribute<int>
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980,
               num_vertices_00);
  }
  std::vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>::~vector
            ((vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_> *)
             CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910)
            );
  pPVar5 = PlyElement::GetPropertyByName
                     (in_stack_fffffffffffff8f8,
                      (string *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  local_1c0 = pPVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910)
            );
  pPVar5 = PlyElement::GetPropertyByName
                     (in_stack_fffffffffffff8f8,
                      (string *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator(&local_211);
  local_1f0 = pPVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910)
            );
  pPVar5 = PlyElement::GetPropertyByName
                     (in_stack_fffffffffffff8f8,
                      (string *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator(&local_241);
  local_220 = pPVar5;
  if (((local_1c0 != (PlyProperty *)0x0) && (local_1f0 != (PlyProperty *)0x0)) &&
     ((pPVar5 != (PlyProperty *)0x0 &&
      (((DVar2 = PlyProperty::data_type(local_1c0), DVar2 == DT_FLOAT32 &&
        (DVar2 = PlyProperty::data_type(local_1f0), DVar2 == DT_FLOAT32)) &&
       (DVar2 = PlyProperty::data_type(local_220), DVar2 == DT_FLOAT32)))))) {
    PlyPropertyReader<float>::PlyPropertyReader
              ((PlyPropertyReader<float> *)
               CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
               (PlyProperty *)in_stack_fffffffffffff928);
    PlyPropertyReader<float>::PlyPropertyReader
              ((PlyPropertyReader<float> *)
               CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
               (PlyProperty *)in_stack_fffffffffffff928);
    PlyPropertyReader<float>::PlyPropertyReader
              ((PlyPropertyReader<float> *)
               CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
               (PlyProperty *)in_stack_fffffffffffff928);
    GeometryAttribute::GeometryAttribute((GeometryAttribute *)pPVar10);
    pPVar10 = (PointCloud *)0x0;
    __p = (pointer)&DAT_0000000c;
    GeometryAttribute::Init
              (in_stack_fffffffffffff900,(Type)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
               (DataBuffer *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
               (uint8_t)((ulong)in_stack_fffffffffffff8e8 >> 0x38),
               (DataType)in_stack_fffffffffffff8e8,false,
               CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910),
               (int64_t)in_stack_fffffffffffff918);
    local_304 = PointCloud::AddAttribute
                          (in_stack_fffffffffffff928,in_stack_fffffffffffff920,
                           SUB81((ulong)in_stack_fffffffffffff918 >> 0x38,0),
                           (ValueType)in_stack_fffffffffffff918);
    for (local_308 = 0; local_308 < local_108; local_308 = local_308 + 1) {
      fVar8 = PlyPropertyReader<float>::ReadValue
                        ((PlyPropertyReader<float> *)pPVar10,(int)((ulong)__p >> 0x20));
      pvVar6 = std::array<float,_3UL>::operator[]((array<float,_3UL> *)pPVar10,(size_type)__p);
      *pvVar6 = fVar8;
      fVar8 = PlyPropertyReader<float>::ReadValue
                        ((PlyPropertyReader<float> *)pPVar10,(int)((ulong)__p >> 0x20));
      pvVar6 = std::array<float,_3UL>::operator[]((array<float,_3UL> *)pPVar10,(size_type)__p);
      *pvVar6 = fVar8;
      fVar8 = PlyPropertyReader<float>::ReadValue
                        ((PlyPropertyReader<float> *)pPVar10,(int)((ulong)__p >> 0x20));
      pvVar6 = std::array<float,_3UL>::operator[]((array<float,_3UL> *)pPVar10,(size_type)__p);
      *pvVar6 = fVar8;
      PointCloud::attribute(pPVar10,(int32_t)((ulong)__p >> 0x20));
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(local_318,local_308);
      std::array<float,_3UL>::operator[]((array<float,_3UL> *)pPVar10,(size_type)__p);
      GeometryAttribute::SetAttributeValue
                (in_stack_fffffffffffff908,in_stack_fffffffffffff914,in_stack_fffffffffffff900);
    }
    PlyPropertyReader<float>::~PlyPropertyReader((PlyPropertyReader<float> *)0x12afb9);
    PlyPropertyReader<float>::~PlyPropertyReader((PlyPropertyReader<float> *)0x12afc6);
    PlyPropertyReader<float>::~PlyPropertyReader((PlyPropertyReader<float> *)0x12afd3);
  }
  local_31c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910)
            );
  pPVar5 = PlyElement::GetPropertyByName
                     (in_stack_fffffffffffff8f8,
                      (string *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator(&local_349);
  local_328 = pPVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910)
            );
  pPVar5 = PlyElement::GetPropertyByName
                     (in_stack_fffffffffffff8f8,
                      (string *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator(&local_379);
  local_358 = pPVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910)
            );
  pPVar5 = PlyElement::GetPropertyByName
                     (in_stack_fffffffffffff8f8,
                      (string *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  local_388 = pPVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910)
            );
  pPVar5 = PlyElement::GetPropertyByName
                     (in_stack_fffffffffffff8f8,
                      (string *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  attribute_type = (Type)((ulong)in_stack_fffffffffffff8f8 >> 0x20);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  if (local_328 != (PlyProperty *)0x0) {
    local_31c = local_31c + 1;
  }
  if (local_358 != (PlyProperty *)0x0) {
    local_31c = local_31c + 1;
  }
  if (local_388 != (PlyProperty *)0x0) {
    local_31c = local_31c + 1;
  }
  if (pPVar5 != (PlyProperty *)0x0) {
    local_31c = local_31c + 1;
  }
  local_3b8 = pPVar5;
  if (local_31c == 0) goto LAB_0012bc88;
  std::
  vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
  ::vector((vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
            *)0x12b3e9);
  if (local_328 == (PlyProperty *)0x0) {
LAB_0012b5c8:
    if (local_358 != (PlyProperty *)0x0) {
      local_400 = local_358;
      DVar2 = PlyProperty::data_type(local_358);
      if (DVar2 != DT_UINT8) {
        std::allocator<char>::allocator();
        CVar9 = (Code)((ulong)__p >> 0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                   (allocator<char> *)
                   CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910));
        Status::Status((Status *)pPVar10,CVar9,(string *)0x12b64e);
        std::__cxx11::string::~string(local_450);
        std::allocator<char>::~allocator(&local_451);
        local_428 = 1;
        goto LAB_0012bc5b;
      }
      operator_new(0x28);
      PlyPropertyReader<unsigned_char>::PlyPropertyReader
                ((PlyPropertyReader<unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                 (PlyProperty *)in_stack_fffffffffffff928);
      std::
      unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>
      ::unique_ptr<std::default_delete<draco::PlyPropertyReader<unsigned_char>>,void>
                ((unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                  *)pPVar10,__p);
      std::
      vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
      ::push_back((vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
                   *)pPVar10,(value_type *)__p);
      std::
      unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
      ::~unique_ptr((unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                     *)pPVar10);
    }
    if (local_388 != (PlyProperty *)0x0) {
      local_400 = local_388;
      in_stack_fffffffffffff934 = PlyProperty::data_type(local_388);
      if (in_stack_fffffffffffff934 != DT_UINT8) {
        std::allocator<char>::allocator();
        CVar9 = (Code)((ulong)__p >> 0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                   (allocator<char> *)
                   CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910));
        Status::Status((Status *)pPVar10,CVar9,(string *)0x12b7f6);
        std::__cxx11::string::~string(local_480);
        std::allocator<char>::~allocator(&local_481);
        local_428 = 1;
        goto LAB_0012bc5b;
      }
      in_stack_fffffffffffff920 = (GeometryAttribute *)operator_new(0x28);
      PlyPropertyReader<unsigned_char>::PlyPropertyReader
                ((PlyPropertyReader<unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                 (PlyProperty *)in_stack_fffffffffffff928);
      in_stack_fffffffffffff918 = local_490;
      std::
      unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>
      ::unique_ptr<std::default_delete<draco::PlyPropertyReader<unsigned_char>>,void>
                ((unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                  *)pPVar10,__p);
      std::
      vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
      ::push_back((vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
                   *)pPVar10,(value_type *)__p);
      std::
      unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
      ::~unique_ptr((unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                     *)pPVar10);
    }
    if (local_3b8 != (PlyProperty *)0x0) {
      local_400 = local_3b8;
      in_stack_fffffffffffff914.value_ = PlyProperty::data_type(local_3b8);
      if (in_stack_fffffffffffff914.value_ != DT_UINT8) {
        std::allocator<char>::allocator();
        CVar9 = (Code)((ulong)__p >> 0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                   (allocator<char> *)
                   CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910));
        Status::Status((Status *)pPVar10,CVar9,(string *)0x12b99e);
        std::__cxx11::string::~string(local_4b0);
        std::allocator<char>::~allocator(&local_4b1);
        local_428 = 1;
        goto LAB_0012bc5b;
      }
      in_stack_fffffffffffff900 = (GeometryAttribute *)operator_new(0x28);
      PlyPropertyReader<unsigned_char>::PlyPropertyReader
                ((PlyPropertyReader<unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                 (PlyProperty *)in_stack_fffffffffffff928);
      attribute_type = (Type)((ulong)local_4c0 >> 0x20);
      std::
      unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>
      ::unique_ptr<std::default_delete<draco::PlyPropertyReader<unsigned_char>>,void>
                ((unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                  *)pPVar10,__p);
      std::
      vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
      ::push_back((vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
                   *)pPVar10,(value_type *)__p);
      std::
      unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
      ::~unique_ptr((unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                     *)pPVar10);
    }
    GeometryAttribute::GeometryAttribute((GeometryAttribute *)pPVar10);
    __n = (size_type)local_31c;
    pPVar10 = (PointCloud *)0x0;
    GeometryAttribute::Init
              (in_stack_fffffffffffff900,attribute_type,
               (DataBuffer *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
               (uint8_t)((ulong)in_stack_fffffffffffff8e8 >> 0x38),
               (DataType)in_stack_fffffffffffff8e8,false,
               CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910),
               (int64_t)in_stack_fffffffffffff918);
    in_stack_fffffffffffff8f4 =
         PointCloud::AddAttribute
                   (in_stack_fffffffffffff928,in_stack_fffffffffffff920,
                    SUB81((ulong)in_stack_fffffffffffff918 >> 0x38,0),
                    (ValueType)in_stack_fffffffffffff918);
    local_504 = in_stack_fffffffffffff8f4;
    for (local_508 = 0; local_508 < local_108; local_508 = local_508 + 1) {
      for (local_510 = 0; local_510 < local_31c; local_510 = local_510 + 1) {
        std::
        vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
        ::operator[](&local_3f8,(long)local_510);
        std::
        unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
        ::operator->((unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                      *)0x12bb99);
        uVar1 = PlyPropertyReader<unsigned_char>::ReadValue
                          ((PlyPropertyReader<unsigned_char> *)pPVar10,(int)(__n >> 0x20));
        in_stack_fffffffffffff8f0 = CONCAT13(uVar1,(int3)in_stack_fffffffffffff8f0);
        pvVar7 = std::array<unsigned_char,_4UL>::operator[]
                           ((array<unsigned_char,_4UL> *)pPVar10,__n);
        *pvVar7 = (value_type_conflict3)((uint)in_stack_fffffffffffff8f0 >> 0x18);
      }
      PointCloud::attribute(pPVar10,(int32_t)(__n >> 0x20));
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_514,local_508)
      ;
      std::array<unsigned_char,_4UL>::operator[]((array<unsigned_char,_4UL> *)pPVar10,__n);
      GeometryAttribute::SetAttributeValue
                (in_stack_fffffffffffff908,in_stack_fffffffffffff914,in_stack_fffffffffffff900);
    }
    local_428 = 0;
  }
  else {
    local_400 = local_328;
    DVar2 = PlyProperty::data_type(local_328);
    if (DVar2 == DT_UINT8) {
      operator_new(0x28);
      PlyPropertyReader<unsigned_char>::PlyPropertyReader
                ((PlyPropertyReader<unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                 (PlyProperty *)in_stack_fffffffffffff928);
      std::
      unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>
      ::unique_ptr<std::default_delete<draco::PlyPropertyReader<unsigned_char>>,void>
                ((unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                  *)pPVar10,__p);
      std::
      vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
      ::push_back((vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
                   *)pPVar10,(value_type *)__p);
      std::
      unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
      ::~unique_ptr((unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                     *)pPVar10);
      goto LAB_0012b5c8;
    }
    std::allocator<char>::allocator();
    CVar9 = (Code)((ulong)__p >> 0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff920,in_stack_fffffffffffff918,
               (allocator<char> *)
               CONCAT44(in_stack_fffffffffffff914.value_,in_stack_fffffffffffff910));
    Status::Status((Status *)pPVar10,CVar9,(string *)0x12b47b);
    std::__cxx11::string::~string(local_420);
    std::allocator<char>::~allocator(&local_421);
    local_428 = 1;
  }
LAB_0012bc5b:
  std::
  vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
  ::~vector((vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  if (local_428 != 0) {
    return in_RDI;
  }
LAB_0012bc88:
  OkStatus();
  return in_RDI;
}

Assistant:

Status PlyDecoder::DecodeVertexData(const PlyElement *vertex_element) {
  if (vertex_element == nullptr) {
    return Status(Status::INVALID_PARAMETER, "vertex_element is null");
  }
  // TODO(b/34330853): For now, try to load x,y,z vertices, red,green,blue,alpha
  // colors, and nx,ny,nz normals. We need to add other properties later.
  const PlyProperty *const x_prop = vertex_element->GetPropertyByName("x");
  const PlyProperty *const y_prop = vertex_element->GetPropertyByName("y");
  const PlyProperty *const z_prop = vertex_element->GetPropertyByName("z");
  if (!x_prop || !y_prop || !z_prop) {
    // Currently, we require 3 vertex coordinates (this should be generalized
    // later on).
    return Status(Status::INVALID_PARAMETER, "x, y, or z property is missing");
  }
  const PointIndex::ValueType num_vertices = vertex_element->num_entries();
  out_point_cloud_->set_num_points(num_vertices);
  // Decode vertex positions.
  {
    // All properties must have the same type.
    if (x_prop->data_type() != y_prop->data_type() ||
        y_prop->data_type() != z_prop->data_type()) {
      return Status(Status::INVALID_PARAMETER,
                    "x, y, and z properties must have the same type");
    }
    // TODO(ostava): For now assume the position types are float32 or int32.
    const DataType dt = x_prop->data_type();
    if (dt != DT_FLOAT32 && dt != DT_INT32) {
      return Status(Status::INVALID_PARAMETER,
                    "x, y, and z properties must be of type float32 or int32");
    }

    GeometryAttribute va;
    va.Init(GeometryAttribute::POSITION, nullptr, 3, dt, false,
            DataTypeLength(dt) * 3, 0);
    const int att_id = out_point_cloud_->AddAttribute(va, true, num_vertices);
    std::vector<const PlyProperty *> properties;
    properties.push_back(x_prop);
    properties.push_back(y_prop);
    properties.push_back(z_prop);
    if (dt == DT_FLOAT32) {
      ReadPropertiesToAttribute<float>(
          properties, out_point_cloud_->attribute(att_id), num_vertices);
    } else if (dt == DT_INT32) {
      ReadPropertiesToAttribute<int32_t>(
          properties, out_point_cloud_->attribute(att_id), num_vertices);
    }
  }

  // Decode normals if present.
  const PlyProperty *const n_x_prop = vertex_element->GetPropertyByName("nx");
  const PlyProperty *const n_y_prop = vertex_element->GetPropertyByName("ny");
  const PlyProperty *const n_z_prop = vertex_element->GetPropertyByName("nz");
  if (n_x_prop != nullptr && n_y_prop != nullptr && n_z_prop != nullptr) {
    // For now, all normal properties must be set and of type float32
    if (n_x_prop->data_type() == DT_FLOAT32 &&
        n_y_prop->data_type() == DT_FLOAT32 &&
        n_z_prop->data_type() == DT_FLOAT32) {
      PlyPropertyReader<float> x_reader(n_x_prop);
      PlyPropertyReader<float> y_reader(n_y_prop);
      PlyPropertyReader<float> z_reader(n_z_prop);
      GeometryAttribute va;
      va.Init(GeometryAttribute::NORMAL, nullptr, 3, DT_FLOAT32, false,
              sizeof(float) * 3, 0);
      const int att_id = out_point_cloud_->AddAttribute(va, true, num_vertices);
      for (PointIndex::ValueType i = 0; i < num_vertices; ++i) {
        std::array<float, 3> val;
        val[0] = x_reader.ReadValue(i);
        val[1] = y_reader.ReadValue(i);
        val[2] = z_reader.ReadValue(i);
        out_point_cloud_->attribute(att_id)->SetAttributeValue(
            AttributeValueIndex(i), &val[0]);
      }
    }
  }

  // Decode color data if present.
  int num_colors = 0;
  const PlyProperty *const r_prop = vertex_element->GetPropertyByName("red");
  const PlyProperty *const g_prop = vertex_element->GetPropertyByName("green");
  const PlyProperty *const b_prop = vertex_element->GetPropertyByName("blue");
  const PlyProperty *const a_prop = vertex_element->GetPropertyByName("alpha");
  if (r_prop) {
    ++num_colors;
  }
  if (g_prop) {
    ++num_colors;
  }
  if (b_prop) {
    ++num_colors;
  }
  if (a_prop) {
    ++num_colors;
  }

  if (num_colors) {
    std::vector<std::unique_ptr<PlyPropertyReader<uint8_t>>> color_readers;
    const PlyProperty *p;
    if (r_prop) {
      p = r_prop;
      // TODO(ostava): For now ensure the data type of all components is uint8.
      DRACO_DCHECK_EQ(true, p->data_type() == DT_UINT8);
      if (p->data_type() != DT_UINT8) {
        return Status(Status::INVALID_PARAMETER,
                      "Type of 'red' property must be uint8");
      }
      color_readers.push_back(std::unique_ptr<PlyPropertyReader<uint8_t>>(
          new PlyPropertyReader<uint8_t>(p)));
    }
    if (g_prop) {
      p = g_prop;
      // TODO(ostava): For now ensure the data type of all components is uint8.
      DRACO_DCHECK_EQ(true, p->data_type() == DT_UINT8);
      if (p->data_type() != DT_UINT8) {
        return Status(Status::INVALID_PARAMETER,
                      "Type of 'green' property must be uint8");
      }
      color_readers.push_back(std::unique_ptr<PlyPropertyReader<uint8_t>>(
          new PlyPropertyReader<uint8_t>(p)));
    }
    if (b_prop) {
      p = b_prop;
      // TODO(ostava): For now ensure the data type of all components is uint8.
      DRACO_DCHECK_EQ(true, p->data_type() == DT_UINT8);
      if (p->data_type() != DT_UINT8) {
        return Status(Status::INVALID_PARAMETER,
                      "Type of 'blue' property must be uint8");
      }
      color_readers.push_back(std::unique_ptr<PlyPropertyReader<uint8_t>>(
          new PlyPropertyReader<uint8_t>(p)));
    }
    if (a_prop) {
      p = a_prop;
      // TODO(ostava): For now ensure the data type of all components is uint8.
      DRACO_DCHECK_EQ(true, p->data_type() == DT_UINT8);
      if (p->data_type() != DT_UINT8) {
        return Status(Status::INVALID_PARAMETER,
                      "Type of 'alpha' property must be uint8");
      }
      color_readers.push_back(std::unique_ptr<PlyPropertyReader<uint8_t>>(
          new PlyPropertyReader<uint8_t>(p)));
    }

    GeometryAttribute va;
    va.Init(GeometryAttribute::COLOR, nullptr, num_colors, DT_UINT8, true,
            sizeof(uint8_t) * num_colors, 0);
    const int32_t att_id =
        out_point_cloud_->AddAttribute(va, true, num_vertices);
    for (PointIndex::ValueType i = 0; i < num_vertices; ++i) {
      std::array<uint8_t, 4> val;
      for (int j = 0; j < num_colors; j++) {
        val[j] = color_readers[j]->ReadValue(i);
      }
      out_point_cloud_->attribute(att_id)->SetAttributeValue(
          AttributeValueIndex(i), &val[0]);
    }
  }

  return OkStatus();
}